

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_xor_vec_aarch64
               (TCGContext_conflict1 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  TCGv_vec b_local;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  vec_gen_op3(tcg_ctx,INDEX_op_xor_vec,0,r,a,b);
  return;
}

Assistant:

void tcg_gen_xor_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    vec_gen_op3(tcg_ctx, INDEX_op_xor_vec, 0, r, a, b);
}